

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::t_formatter::format(t_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  uint uVar1;
  scoped_pad p;
  scoped_pad local_40;
  
  if ((this->super_flag_formatter).padinfo_.width_ != 0) {
    uVar1 = fmt::v5::internal::count_digits(msg->thread_id);
    scoped_pad::scoped_pad(&local_40,(ulong)uVar1,&(this->super_flag_formatter).padinfo_,dest);
    fmt_helper::append_int<unsigned_long,500ul>(msg->thread_id,dest);
    scoped_pad::~scoped_pad(&local_40);
    return;
  }
  fmt_helper::append_int<unsigned_long,500ul>(msg->thread_id,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        if (padinfo_.enabled())
        {
            const auto field_size = fmt_helper::count_digits(msg.thread_id);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(msg.thread_id, dest);
        }
        else
        {
            fmt_helper::append_int(msg.thread_id, dest);
        }
    }